

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.h
# Opt level: O2

void __thiscall
draco::PointAttribute::GetMappedValue(PointAttribute *this,PointIndex point_index,void *out_data)

{
  size_t __n;
  
  if (this->identity_mapping_ == false) {
    point_index.value_ =
         (this->indices_map_).vector_.
         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[point_index.value_].value_;
  }
  __n = (this->super_GeometryAttribute).byte_stride_;
  memcpy(out_data,(void *)((long)(((this->super_GeometryAttribute).buffer_)->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                           (this->super_GeometryAttribute).byte_offset_ + point_index.value_ * __n),
         __n);
  return;
}

Assistant:

void GetMappedValue(PointIndex point_index, void *out_data) const {
    return GetValue(mapped_index(point_index), out_data);
  }